

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool anon_unknown.dwarf_ed2ca6::cmakeCheckStampFile(string *stampName)

{
  bool bVar1;
  RenameResult RVar2;
  ostream *poVar3;
  string stampTemp;
  string stampDepends;
  string local_5d0;
  ostringstream stampTempStream;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0 [22];
  string err;
  ifstream fin;
  byte abStack_218 [488];
  
  cmStrCat<std::__cxx11::string_const&,char_const(&)[8]>
            (&stampDepends,stampName,(char (*) [8])".depend");
  std::ifstream::ifstream(&fin,stampDepends._M_dataplus._M_p,_S_in);
  if ((abStack_218[(long)_fin[-3]] & 5) == 0) {
    cmFileTimeCache::cmFileTimeCache((cmFileTimeCache *)&err);
    _stampTempStream = (pointer)local_5a0;
    local_5a0[0]._M_local_buf[0] = '\0';
    do {
      bVar1 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)&fin,(string *)&stampTempStream,(bool *)0x0,0xffffffffffffffff);
    } while (bVar1);
    std::__cxx11::string::~string((string *)&stampTempStream);
    cmFileTimeCache::~cmFileTimeCache((cmFileTimeCache *)&err);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stampTempStream);
    poVar3 = std::operator<<((ostream *)&stampTempStream,(string *)stampName);
    poVar3 = std::operator<<(poVar3,".tmp");
    cmSystemTools::RandomSeed();
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream
              (&err,(char *)CONCAT44(stampTemp._M_dataplus._M_p._4_4_,
                                     stampTemp._M_dataplus._M_p._0_4_),_S_out);
    std::operator<<((ostream *)&err,"# CMake generation timestamp file for this directory.\n");
    std::ofstream::~ofstream(&err);
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    RVar2 = cmSystemTools::RenameFile(&stampTemp,stampName,Yes,&err);
    bVar1 = RVar2 == Success;
    if (!bVar1) {
      cmsys::SystemTools::RemoveFile(&stampTemp);
      cmStrCat<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string&>
                (&local_5d0,(char (*) [27])"Cannot restore timestamp \"",stampName,
                 (char (*) [4])0x7ad35b,&err);
      cmSystemTools::Error(&local_5d0);
      std::__cxx11::string::~string((string *)&local_5d0);
    }
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&stampTemp);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stampTempStream);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"CMake is re-running because ");
    poVar3 = std::operator<<(poVar3,(string *)stampName);
    std::operator<<(poVar3," dependency file is missing.\n");
    bVar1 = false;
  }
  std::ifstream::~ifstream(&fin);
  std::__cxx11::string::~string((string *)&stampDepends);
  return bVar1;
}

Assistant:

bool cmakeCheckStampFile(const std::string& stampName)
{
  // The stamp file does not exist.  Use the stamp dependencies to
  // determine whether it is really out of date.  This works in
  // conjunction with cmLocalVisualStudio7Generator to avoid
  // repeatedly re-running CMake when the user rebuilds the entire
  // solution.
  std::string stampDepends = cmStrCat(stampName, ".depend");
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(stampDepends.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(stampDepends.c_str());
#endif
  if (!fin) {
    // The stamp dependencies file cannot be read.  Just assume the
    // build system is really out of date.
    std::cout << "CMake is re-running because " << stampName
              << " dependency file is missing.\n";
    return false;
  }

  // Compare the stamp dependencies against the dependency file itself.
  {
    cmFileTimeCache ftc;
    std::string dep;
    while (cmSystemTools::GetLineFromStream(fin, dep)) {
      int result;
      if (!dep.empty() && dep[0] != '#' &&
          (!ftc.Compare(stampDepends, dep, &result) || result < 0)) {
        // The stamp depends file is older than this dependency.  The
        // build system is really out of date.
        /* clang-format off */
        std::cout << "CMake is re-running because " << stampName
                  << " is out-of-date.\n"
                     "  the file '" << dep << "'\n"
                     "  is newer than '" << stampDepends << "'\n"
                     "  result='" << result << "'\n";
        /* clang-format on */
        return false;
      }
    }
  }

  // The build system is up to date.  The stamp file has been removed
  // by the VS IDE due to a "rebuild" request.  Restore it atomically.
  std::ostringstream stampTempStream;
  stampTempStream << stampName << ".tmp" << cmSystemTools::RandomSeed();
  std::string stampTemp = stampTempStream.str();
  {
    // TODO: Teach cmGeneratedFileStream to use a random temp file (with
    // multiple tries in unlikely case of conflict) and use that here.
    cmsys::ofstream stamp(stampTemp.c_str());
    stamp << "# CMake generation timestamp file for this directory.\n";
  }
  std::string err;
  if (cmSystemTools::RenameFile(stampTemp, stampName,
                                cmSystemTools::Replace::Yes, &err) ==
      cmSystemTools::RenameResult::Success) {
    // CMake does not need to re-run because the stamp file is up-to-date.
    return true;
  }
  cmSystemTools::RemoveFile(stampTemp);
  cmSystemTools::Error(
    cmStrCat("Cannot restore timestamp \"", stampName, "\": ", err));
  return false;
}